

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
createMaxConcurrentTest<vkt::api::(anonymous_namespace)::DescriptorSetLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  pointer *this;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  ulong __n;
  TestContext *pTVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  Unique<vk::Handle<(vk::HandleType)19>_> *this_01;
  reference this_02;
  allocator<char> local_2d9;
  string local_2d8;
  undefined1 local_2b1;
  Move<vk::Handle<(vk::HandleType)19>_> local_2b0;
  RefData<vk::Handle<(vk::HandleType)19>_> local_290;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_> local_270;
  uint local_25c;
  char *pcStack_258;
  deUint32 ndx;
  MessageBuilder local_250;
  undefined4 local_d0;
  deUint32 watchdogInterval;
  allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_> local_b9;
  undefined1 local_b8 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
  objects;
  Resources res;
  Environment env;
  deUint32 numObjects;
  Parameters *params_local;
  Context *context_local;
  
  env._52_4_ = DescriptorSetLayout::getMaxConcurrent(context,params);
  this = &res.immutableSamplersPtr.
          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Environment::Environment((Environment *)this,context,env._52_4_);
  DescriptorSetLayout::Resources::Resources
            ((Resources *)
             &objects.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Environment *)this,params);
  __n = (ulong)(uint)env._52_4_;
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>::
  allocator(&local_b9);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
            *)local_b8,__n,&local_b9);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>::
  ~allocator(&local_b9);
  local_d0 = 0x400;
  pTVar1 = Context::getTestContext(context);
  this_00 = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<(&local_250,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_250,(char (*) [10])"Creating ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)&env.field_0x34);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x13b8ff9);
  pcStack_258 = ::vk::getTypeName<vk::Handle<(vk::HandleType)19>>();
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&stack0xfffffffffffffda8);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [9])0x13837bb);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_250);
  for (local_25c = 0; local_25c < (uint)env._52_4_; local_25c = local_25c + 1) {
    this_01 = (Unique<vk::Handle<(vk::HandleType)19>_> *)operator_new(0x20);
    local_2b1 = 1;
    DescriptorSetLayout::create
              (&local_2b0,
               (Environment *)
               &res.immutableSamplersPtr.
                super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (Resources *)
               &objects.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,params);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_290,(Move *)&local_2b0);
    data.deleter.m_deviceIface = local_290.deleter.m_deviceIface;
    data.object.m_internal = local_290.object.m_internal;
    data.deleter.m_device = local_290.deleter.m_device;
    data.deleter.m_allocator = local_290.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique(this_01,data);
    local_2b1 = 0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>::SharedPtr
              (&local_270,this_01);
    this_02 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
                            *)local_b8,(ulong)local_25c);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>::operator=
              (this_02,&local_270);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>::~SharedPtr(&local_270);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_2b0);
    if ((local_25c != 0) && ((local_25c & 0x3ff) == 0)) {
      pTVar1 = Context::getTestContext(context);
      tcu::TestContext::touchWatchdog(pTVar1);
    }
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
  ::clear((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
           *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"Ok",&local_2d9);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
             *)local_b8);
  DescriptorSetLayout::Resources::~Resources
            ((Resources *)
             &objects.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}